

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::System::Type::func(Type *this,DataList *list)

{
  Object *obj;
  Object **ppOVar1;
  lightlist<ICM::Object_*> *in_RDX;
  TypeType local_28;
  lightlist<ICM::Object_*> *local_20;
  DataList *list_local;
  Type *this_local;
  
  local_20 = in_RDX;
  list_local = list;
  this_local = this;
  obj = (Object *)operator_new(0x10);
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[](local_20,0);
  TypeBase::TypeType::TypeType(&local_28,(*ppOVar1)->type);
  Objects::DataObject<(ICM::DefaultType)14>::DataObject
            ((DataObject<(ICM::DefaultType)14> *)obj,&local_28);
  ObjectPtr::ObjectPtr((ObjectPtr *)this,obj);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					return ObjectPtr(new Objects::Type(list[0]->type));
				}